

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakSet.cpp
# Opt level: O0

void __thiscall
Js::JavascriptWeakSet::MarkVisitKindSpecificPtrs
          (JavascriptWeakSet *this,SnapshotExtractor *extractor)

{
  bool bVar1;
  ScriptContext *local_20;
  ScriptContext *scriptContext;
  SnapshotExtractor *extractor_local;
  JavascriptWeakSet *this_local;
  
  scriptContext = (ScriptContext *)extractor;
  extractor_local = (SnapshotExtractor *)this;
  local_20 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  bVar1 = ScriptContext::IsTTDReplayModeEnabled(local_20);
  if (bVar1) {
    Map<Js::JavascriptWeakSet::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor*)::__0>
              (this,(anon_class_8_1_1b6df084)&local_20);
  }
  return;
}

Assistant:

void JavascriptWeakSet::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        //All weak things should be reachable from another root so no need to mark but do need to repopulate the pin sets if in replay mode
        Js::ScriptContext* scriptContext = this->GetScriptContext();
        if(scriptContext->IsTTDReplayModeEnabled())
        {
            this->Map([&](RecyclableObject* key)
            {
                scriptContext->TTDContextInfo->TTDWeakReferencePinSet->AddNew(key);
            });
        }
    }